

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TextEx(char *text,char *text_end,ImGuiTextFlags flags)

{
  ImGuiContext *pIVar1;
  float fVar2;
  bool bVar3;
  int iVar4;
  ImGuiWindow *pIVar5;
  size_t sVar6;
  float fVar7;
  ImVec2 IVar8;
  float local_14c;
  ImVec2 local_114;
  undefined1 local_10c [8];
  ImRect bb_1;
  ImVec2 text_size_1;
  float wrap_width;
  undefined1 local_e8 [8];
  ImRect bb;
  float local_d0;
  char *local_c8;
  char *line_end_2;
  int lines_skipped_1;
  float local_b0;
  char *local_a8;
  char *line_end_1;
  ImVec2 local_98;
  undefined1 local_90 [8];
  ImRect line_rect;
  char *local_78;
  char *line_end;
  int lines_skipped;
  int lines_skippable;
  ImVec2 pos;
  ImVec2 text_size;
  float line_height;
  char *line;
  float fStack_40;
  bool wrap_enabled;
  float wrap_pos_x;
  ImVec2 text_pos;
  char *text_begin;
  ImGuiContext *g;
  ImGuiWindow *window;
  char *pcStack_18;
  ImGuiTextFlags flags_local;
  char *text_end_local;
  char *text_local;
  
  pIVar5 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar5->SkipItems & 1U) == 0) {
    if (text == (char *)0x0) {
      __assert_fail("text != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui_widgets.cpp"
                    ,0x92,"void ImGui::TextEx(const char *, const char *, ImGuiTextFlags)");
    }
    text_pos = (ImVec2)text;
    pcStack_18 = text_end;
    if (text_end == (char *)0x0) {
      sVar6 = strlen(text);
      pcStack_18 = text + sVar6;
    }
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc0,(pIVar5->DC).CursorPos.x,
                   (pIVar5->DC).CursorPos.y + (pIVar5->DC).CurrLineTextBaseOffset);
    fVar7 = (pIVar5->DC).TextWrapPos;
    if (((long)pcStack_18 - (long)text < 0x7d1) || (0.0 <= fVar7)) {
      if (0.0 <= fVar7) {
        local_14c = CalcWrapWidthForPos(&(pIVar5->DC).CursorPos,fVar7);
      }
      else {
        local_14c = 0.0;
      }
      text_size_1.x = local_14c;
      bb_1.Max = CalcTextSize((char *)text_pos,pcStack_18,false,local_14c);
      local_114 = operator+((ImVec2 *)&stack0xffffffffffffffc0,&bb_1.Max);
      ImRect::ImRect((ImRect *)local_10c,(ImVec2 *)&stack0xffffffffffffffc0,&local_114);
      ItemSize(&bb_1.Max,0.0);
      bVar3 = ItemAdd((ImRect *)local_10c,0,(ImRect *)0x0);
      if (bVar3) {
        RenderTextWrapped((ImVec2)local_10c,(char *)text_pos,pcStack_18,text_size_1.x);
      }
    }
    else {
      fVar7 = GetTextLineHeight();
      ImVec2::ImVec2(&pos,0.0,0.0);
      lines_skippable = (int)wrap_pos_x;
      lines_skipped = (int)fStack_40;
      unique0x10000510 = text;
      if (((pIVar1->LogEnabled & 1U) == 0) &&
         (iVar4 = (int)(((pIVar5->ClipRect).Min.y - wrap_pos_x) / fVar7), 0 < iVar4)) {
        line_end._4_4_ = 0;
        while (stack0xffffffffffffffb0 < pcStack_18 && line_end._4_4_ < iVar4) {
          local_78 = (char *)memchr(stack0xffffffffffffffb0,10,
                                    (long)pcStack_18 - (long)stack0xffffffffffffffb0);
          fVar2 = pos.x;
          if (local_78 == (char *)0x0) {
            local_78 = pcStack_18;
          }
          if ((flags & 1U) == 0) {
            line_rect.Max = CalcTextSize(stack0xffffffffffffffb0,local_78,false,-1.0);
            pos.x = ImMax<float>(fVar2,line_rect.Max.x);
          }
          line_end._4_4_ = line_end._4_4_ + 1;
          register0x00000000 = local_78 + 1;
        }
        lines_skippable = (int)((float)line_end._4_4_ * fVar7 + (float)lines_skippable);
      }
      if (stack0xffffffffffffffb0 < pcStack_18) {
        ImVec2::ImVec2((ImVec2 *)&line_end_1,3.4028235e+38,fVar7);
        local_98 = operator+((ImVec2 *)&lines_skipped,(ImVec2 *)&line_end_1);
        ImRect::ImRect((ImRect *)local_90,(ImVec2 *)&lines_skipped,&local_98);
        while ((stack0xffffffffffffffb0 < pcStack_18 &&
               (bVar3 = IsClippedEx((ImRect *)local_90,0,false), !bVar3))) {
          local_a8 = (char *)memchr(stack0xffffffffffffffb0,10,
                                    (long)pcStack_18 - (long)stack0xffffffffffffffb0);
          fVar2 = pos.x;
          if (local_a8 == (char *)0x0) {
            local_a8 = pcStack_18;
          }
          IVar8 = CalcTextSize(stack0xffffffffffffffb0,local_a8,false,-1.0);
          local_b0 = IVar8.x;
          pos.x = ImMax<float>(fVar2,local_b0);
          RenderText(_lines_skipped,stack0xffffffffffffffb0,local_a8,false);
          register0x00000000 = local_a8 + 1;
          local_90._4_4_ = fVar7 + (float)local_90._4_4_;
          line_rect.Min.y = fVar7 + line_rect.Min.y;
          lines_skippable = (int)(fVar7 + (float)lines_skippable);
        }
        line_end_2._4_4_ = 0;
        while (stack0xffffffffffffffb0 < pcStack_18) {
          local_c8 = (char *)memchr(stack0xffffffffffffffb0,10,
                                    (long)pcStack_18 - (long)stack0xffffffffffffffb0);
          fVar2 = pos.x;
          if (local_c8 == (char *)0x0) {
            local_c8 = pcStack_18;
          }
          if ((flags & 1U) == 0) {
            IVar8 = CalcTextSize(stack0xffffffffffffffb0,local_c8,false,-1.0);
            local_d0 = IVar8.x;
            pos.x = ImMax<float>(fVar2,local_d0);
          }
          line_end_2._4_4_ = line_end_2._4_4_ + 1;
          register0x00000000 = local_c8 + 1;
        }
        lines_skippable = (int)((float)line_end_2._4_4_ * fVar7 + (float)lines_skippable);
      }
      bb.Max = ::operator-((ImVec2 *)&lines_skipped,(ImVec2 *)&stack0xffffffffffffffc0);
      pos.y = bb.Max.y;
      register0x00001200 = operator+((ImVec2 *)&stack0xffffffffffffffc0,&pos);
      ImRect::ImRect((ImRect *)local_e8,(ImVec2 *)&stack0xffffffffffffffc0,(ImVec2 *)&text_size_1.y)
      ;
      ItemSize(&pos,0.0);
      ItemAdd((ImRect *)local_e8,0,(ImRect *)0x0);
    }
  }
  return;
}

Assistant:

void ImGui::TextEx(const char* text, const char* text_end, ImGuiTextFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    IM_ASSERT(text != NULL);
    const char* text_begin = text;
    if (text_end == NULL)
        text_end = text + strlen(text); // FIXME-OPT

    const ImVec2 text_pos(window->DC.CursorPos.x, window->DC.CursorPos.y + window->DC.CurrLineTextBaseOffset);
    const float wrap_pos_x = window->DC.TextWrapPos;
    const bool wrap_enabled = (wrap_pos_x >= 0.0f);
    if (text_end - text > 2000 && !wrap_enabled)
    {
        // Long text!
        // Perform manual coarse clipping to optimize for long multi-line text
        // - From this point we will only compute the width of lines that are visible. Optimization only available when word-wrapping is disabled.
        // - We also don't vertically center the text within the line full height, which is unlikely to matter because we are likely the biggest and only item on the line.
        // - We use memchr(), pay attention that well optimized versions of those str/mem functions are much faster than a casually written loop.
        const char* line = text;
        const float line_height = GetTextLineHeight();
        ImVec2 text_size(0, 0);

        // Lines to skip (can't skip when logging text)
        ImVec2 pos = text_pos;
        if (!g.LogEnabled)
        {
            int lines_skippable = (int)((window->ClipRect.Min.y - text_pos.y) / line_height);
            if (lines_skippable > 0)
            {
                int lines_skipped = 0;
                while (line < text_end && lines_skipped < lines_skippable)
                {
                    const char* line_end = (const char*)memchr(line, '\n', text_end - line);
                    if (!line_end)
                        line_end = text_end;
                    if ((flags & ImGuiTextFlags_NoWidthForLargeClippedText) == 0)
                        text_size.x = ImMax(text_size.x, CalcTextSize(line, line_end).x);
                    line = line_end + 1;
                    lines_skipped++;
                }
                pos.y += lines_skipped * line_height;
            }
        }

        // Lines to render
        if (line < text_end)
        {
            ImRect line_rect(pos, pos + ImVec2(FLT_MAX, line_height));
            while (line < text_end)
            {
                if (IsClippedEx(line_rect, 0, false))
                    break;

                const char* line_end = (const char*)memchr(line, '\n', text_end - line);
                if (!line_end)
                    line_end = text_end;
                text_size.x = ImMax(text_size.x, CalcTextSize(line, line_end).x);
                RenderText(pos, line, line_end, false);
                line = line_end + 1;
                line_rect.Min.y += line_height;
                line_rect.Max.y += line_height;
                pos.y += line_height;
            }

            // Count remaining lines
            int lines_skipped = 0;
            while (line < text_end)
            {
                const char* line_end = (const char*)memchr(line, '\n', text_end - line);
                if (!line_end)
                    line_end = text_end;
                if ((flags & ImGuiTextFlags_NoWidthForLargeClippedText) == 0)
                    text_size.x = ImMax(text_size.x, CalcTextSize(line, line_end).x);
                line = line_end + 1;
                lines_skipped++;
            }
            pos.y += lines_skipped * line_height;
        }
        text_size.y = (pos - text_pos).y;

        ImRect bb(text_pos, text_pos + text_size);
        ItemSize(text_size, 0.0f);
        ItemAdd(bb, 0);
    }
    else
    {
        const float wrap_width = wrap_enabled ? CalcWrapWidthForPos(window->DC.CursorPos, wrap_pos_x) : 0.0f;
        const ImVec2 text_size = CalcTextSize(text_begin, text_end, false, wrap_width);

        ImRect bb(text_pos, text_pos + text_size);
        ItemSize(text_size, 0.0f);
        if (!ItemAdd(bb, 0))
            return;

        // Render (we don't hide text after ## in this end-user function)
        RenderTextWrapped(bb.Min, text_begin, text_end, wrap_width);
    }
}